

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O2

bool __thiscall CLI::Option::remove_excludes(Option *this,Option *opt)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_const_iterator<CLI::Option_*> __position;
  
  p_Var1 = &(this->excludes_)._M_t._M_impl.super__Rb_tree_header;
  __position = ::std::
               __find_if<std::_Rb_tree_const_iterator<CLI::Option*>,__gnu_cxx::__ops::_Iter_equals_val<CLI::Option*const>>
                         ((this->excludes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                          p_Var1);
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    ::std::
    _Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
    ::erase_abi_cxx11_((_Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
                        *)&this->excludes_,(const_iterator)__position._M_node);
  }
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

CLI11_INLINE bool Option::remove_excludes(Option *opt) {
    auto iterator = std::find(std::begin(excludes_), std::end(excludes_), opt);

    if(iterator == std::end(excludes_)) {
        return false;
    }
    excludes_.erase(iterator);
    return true;
}